

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall List<int>::RemoveAll(List<int> *this)

{
  NODE<int>_conflict *pNVar1;
  
  while ((pNVar1 = this->m_pHead, pNVar1 != (NODE<int>_conflict *)0x0 &&
         (pNVar1->pNext != (NODE<int>_conflict *)0x0))) {
    this->m_pHead = pNVar1->pNext;
    operator_delete(pNVar1);
  }
  operator_delete(pNVar1);
  this->m_pHead = (NODE<int>_conflict *)0x0;
  return;
}

Assistant:

inline void List<T>::RemoveAll() {
    NODE<T> *pNode;
    while (m_pHead != NULL) {
        pNode = m_pHead;
        if (m_pHead->pNext == NULL)
            break;
        m_pHead = m_pHead->pNext;

        delete pNode;
    }
    pNode = m_pHead;
    delete pNode;
    m_pHead = NULL; //đánh dấu mảng rỗng
}